

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilSort.c
# Opt level: O1

void Abc_QuickSort3(word *pData,int nSize,int fDecrease)

{
  ulong uVar1;
  
  if (fDecrease == 0) {
    Abc_QuickSort2Inc_rec(pData,0,nSize + -1);
    if (1 < nSize) {
      uVar1 = 1;
      do {
        if ((uint)pData[uVar1] < (uint)pData[uVar1 - 1]) {
          __assert_fail("(unsigned)pData[i-1] <= (unsigned)pData[i]",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilSort.c"
                        ,0x2b7,"void Abc_QuickSort3(word *, int, int)");
        }
        uVar1 = uVar1 + 1;
      } while ((uint)nSize != uVar1);
    }
  }
  else {
    Abc_QuickSort2Dec_rec(pData,0,nSize + -1);
    if (1 < nSize) {
      uVar1 = 1;
      do {
        if ((uint)pData[uVar1 - 1] < (uint)pData[uVar1]) {
          __assert_fail("(unsigned)pData[i-1] >= (unsigned)pData[i]",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilSort.c"
                        ,0x2b0,"void Abc_QuickSort3(word *, int, int)");
        }
        uVar1 = uVar1 + 1;
      } while ((uint)nSize != uVar1);
    }
  }
  return;
}

Assistant:

void Abc_QuickSort3( word * pData, int nSize, int fDecrease )
{
    int i, fVerify = 1;
    if ( fDecrease )
    {
        Abc_QuickSort2Dec_rec( pData, 0, nSize - 1 );
        if ( fVerify )
            for ( i = 1; i < nSize; i++ )
                assert( (unsigned)pData[i-1] >= (unsigned)pData[i] );
    }
    else
    {
        Abc_QuickSort2Inc_rec( pData, 0, nSize - 1 );
        if ( fVerify )
            for ( i = 1; i < nSize; i++ )
                assert( (unsigned)pData[i-1] <= (unsigned)pData[i] );
    }
}